

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.c
# Opt level: O1

int send_msg(http_reply *http,int do_post,char *scep_operation,int operation,char *M_char,
            char *payload,size_t payload_len,int p_flag,char *host_name,int host_port,char *dir_name
            )

{
  uint uVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  ulong uVar5;
  uint __seconds;
  char *pcVar6;
  size_t rlen;
  char local_403e [6];
  char local_4038 [16392];
  
  pcVar4 = "POST";
  if (do_post == 0) {
    pcVar4 = "GET";
  }
  pcVar6 = "";
  if (p_flag == 0) {
    pcVar6 = "/";
  }
  uVar1 = snprintf(local_4038,0x4000,"%s %s%s?operation=%s",pcVar4,pcVar6,dir_name,scep_operation);
  uVar5 = (ulong)(int)uVar1;
  exit_string_overflow((uint)(0x3fff < uVar1));
  if (payload_len != 0 && do_post == 0) {
    pcVar4 = url_encode(payload,payload_len);
    iVar2 = snprintf(local_4038 + uVar5,0x4000 - uVar5,"&message=%s",pcVar4);
    uVar5 = uVar5 + (long)iVar2;
    free(pcVar4);
    exit_string_overflow((uint)(0x3fff < uVar5));
  }
  if (M_char != (char *)0x0) {
    iVar2 = snprintf(local_4038 + uVar5,0x4000 - uVar5,"&%s",M_char);
    uVar5 = uVar5 + (long)iVar2;
    exit_string_overflow((uint)(0x3fff < uVar5));
  }
  if (host_port == 0x50) {
    iVar2 = snprintf(local_4038 + uVar5,0x4000 - uVar5,
                     " HTTP/1.1\r\nHost: %s\r\nConnection: close\r\n",host_name);
  }
  else {
    iVar2 = snprintf(local_4038 + uVar5,0x4000 - uVar5,
                     " HTTP/1.1\r\nHost: %s:%d\r\nConnection: close\r\n",host_name);
  }
  uVar5 = uVar5 + (long)iVar2;
  exit_string_overflow((uint)(0x3fff < uVar5));
  if (do_post != 0) {
    iVar2 = snprintf(local_4038 + uVar5,0x4000 - uVar5,"Content-Length: %zu\r\n",payload_len);
    uVar5 = uVar5 + (long)iVar2;
    exit_string_overflow((uint)(0x3fff < uVar5));
  }
  iVar2 = snprintf(local_4038 + uVar5,0x4000 - uVar5,"\r\n");
  rlen = (long)iVar2 + uVar5;
  exit_string_overflow((uint)(0x3fff < rlen));
  if (do_post != 0) {
    memcpy(local_4038 + rlen,payload,payload_len);
    rlen = rlen + payload_len;
    exit_string_overflow((uint)(0x3fff < rlen));
  }
  if (d_flag != 0) {
    fprintf(_stdout,"%s: scep request:\n%s",pname,local_4038);
  }
  iVar2 = 0;
  sprintf(local_403e,"%d",(ulong)(uint)host_port);
  uVar1 = 1;
  while (iVar3 = http_request(http,host_name,local_403e,local_4038,rlen), iVar3 != 0) {
    if ((iVar3 == 2) || (__seconds = W_flag - iVar2, __seconds == 0 || W_flag < iVar2))
    goto LAB_0010b11d;
    iVar2 = iVar2 + uVar1;
    if (W_flag < iVar2) {
      sleep(__seconds);
      iVar2 = W_flag;
    }
    else {
      sleep(uVar1);
    }
    uVar1 = uVar1 + 1;
  }
  if (operation == 0x1f) {
    http->type = 0xf;
LAB_0010b0ef:
    iVar2 = 0;
  }
  else {
    if (operation == 0xf) {
      if ((http->mime_type != (char *)0x0) &&
         (iVar2 = strcmp(http->mime_type,"application/x-x509-next-ca-cert"), iVar2 == 0)) {
        http->type = 7;
        goto LAB_0010b0ef;
      }
    }
    else if (operation == 1) {
      pcVar4 = http->mime_type;
      if (pcVar4 != (char *)0x0) {
        iVar2 = strcmp(pcVar4,"application/x-x509-ca-cert");
        if (iVar2 == 0) {
          http->type = 1;
        }
        else {
          if ((pcVar4 == (char *)0x0) ||
             ((iVar2 = strcmp(pcVar4,"application/x-x509-ca-ra-cert"), iVar2 != 0 &&
              (iVar2 = strcmp(pcVar4,"application/x-x509-ra-ca-certs"), iVar2 != 0))))
          goto LAB_0010b111;
          http->type = 3;
        }
        goto LAB_0010b0ef;
      }
    }
    else if ((http->mime_type != (char *)0x0) &&
            (iVar2 = strcmp(http->mime_type,"application/x-pki-message"), iVar2 == 0)) {
      http->type = 5;
      goto LAB_0010b0ef;
    }
LAB_0010b111:
    if (v_flag != 0) {
      send_msg_cold_1();
    }
LAB_0010b11d:
    iVar2 = 1;
  }
  return iVar2;
}

Assistant:

int
send_msg(struct http_reply *http, int do_post, char *scep_operation,
		int operation, char *M_char, char *payload, size_t payload_len,
		int p_flag, char *host_name, int host_port, char *dir_name)
{
	char			http_string[16384];
	size_t			rlen;
	char			port_str[6]; /* Range-checked to be max. 5-digit number */
	int ret, fail_count, waited_sec;

	rlen = snprintf(http_string, sizeof(http_string),
		"%s %s%s?operation=%s",
		do_post ? "POST" : "GET", p_flag ? "" : "/", dir_name, scep_operation);
	exit_string_overflow(sizeof(http_string) <= rlen);

	if (!do_post && payload_len > 0) {
		char *encoded = url_encode((char *)payload, payload_len);
		rlen += snprintf(http_string+rlen, sizeof(http_string)-rlen,
				"&message=%s", encoded);
		free(encoded);
		exit_string_overflow(sizeof(http_string) <= rlen);
	}

	if (M_char != NULL) {
		rlen += snprintf(http_string+rlen, sizeof(http_string)-rlen,
				"&%s", M_char);
		exit_string_overflow(sizeof(http_string) <= rlen);
	}

	if (host_port == 80) {
		rlen += snprintf(http_string+rlen, sizeof(http_string)-rlen,
						" HTTP/1.1\r\n"
						"Host: %s\r\n"
						"Connection: close\r\n", host_name);
	} else {
		/* According to RFC2616, non-default port must be added. */
		rlen += snprintf(http_string+rlen, sizeof(http_string)-rlen,
				" HTTP/1.1\r\n"
				"Host: %s:%d\r\n"
				"Connection: close\r\n", host_name, host_port);
	}
	exit_string_overflow(sizeof(http_string) <= rlen);

	if (do_post) {
		rlen += snprintf(http_string+rlen, sizeof(http_string)-rlen,
				"Content-Length: %zu\r\n", payload_len);
		exit_string_overflow(sizeof(http_string) <= rlen);
	}

	rlen += snprintf(http_string+rlen, sizeof(http_string)-rlen,
			"\r\n");
	exit_string_overflow(sizeof(http_string) <= rlen);

	if (do_post) {
		/* concat post data */
		memcpy(http_string+rlen, payload, payload_len);

		rlen += payload_len;
		exit_string_overflow(sizeof(http_string) <= rlen);
	}

	if (d_flag){
		fprintf(stdout, "%s: scep request:\n%s", pname, http_string);
	}

	sprintf(port_str, "%d", host_port);

	fail_count = 0;
	waited_sec = 0;
	/* will retry with linear backoff, just like wget does */
	while (1) {
		ret = http_request(http, host_name, port_str, http_string, rlen);
		if (ret == 0)
			break;
		if (ret == 2 || waited_sec >= W_flag)
			return (1);

		++fail_count;
		if ((waited_sec + fail_count) <= W_flag) {
			sleep(fail_count);
			waited_sec += fail_count;
		} else {
			sleep(W_flag - waited_sec);
			waited_sec = W_flag;
		}
	}

	/* Set SCEP reply type */
	switch (operation) {
		case SCEP_OPERATION_GETCA:
			if (http->mime_type && !strcmp(http->mime_type, MIME_GETCA)) {
				http->type = SCEP_MIME_GETCA;
			} else if (http->mime_type && (!strcmp(http->mime_type, MIME_GETCA_RA) || !strcmp(http->mime_type, MIME_GETCA_RA_ENTRUST))) {
				http->type = SCEP_MIME_GETCA_RA;
			} else {
				goto mime_err;
			}
			break;
		case SCEP_OPERATION_GETNEXTCA:
			if (http->mime_type && !strcmp(http->mime_type, MIME_GETNEXTCA)) {
				http->type = SCEP_MIME_GETNEXTCA;
			} else {
				goto mime_err;
			}
			break;
		case SCEP_OPERATION_GETCAPS:
			/* RFC8894: Clients SHOULD ignore the Content-type, as older
                           implementations of SCEP may send various Content-types. */
			http->type = SCEP_MIME_GETCAPS;
			break;
		default:
			if (http->mime_type && !strcmp(http->mime_type, MIME_PKI)) {
				http->type = SCEP_MIME_PKI;
			} else {
				goto mime_err;
			}
			break;
	}

	return (0);

mime_err:
	if (v_flag)
		fprintf(stderr, "%s: wrong (or missing) MIME content type\n", pname);

	return (1);
}